

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this,Arena *arena)

{
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = arena;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_003e0058;
  this->_has_bits_ = (uint32  [1])0x0;
  this->_cached_size_ = (atomic<int>)0x0;
  (this->dependency_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->message_type_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->service_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->service_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.arena_ = arena;
  (this->public_dependency_).current_size_ = 0;
  (this->public_dependency_).total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  (this->public_dependency_).arena_or_elements_ = arena;
  (this->weak_dependency_).current_size_ = 0;
  (this->weak_dependency_).total_size_ = 0;
  (this->weak_dependency_).arena_or_elements_ = arena;
  SharedCtor(this);
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(::PROTOBUF_NAMESPACE_ID::Arena* arena)
  : ::PROTOBUF_NAMESPACE_ID::Message(arena),
  dependency_(arena),
  message_type_(arena),
  enum_type_(arena),
  service_(arena),
  extension_(arena),
  public_dependency_(arena),
  weak_dependency_(arena) {
  SharedCtor();
  RegisterArenaDtor(arena);
  // @@protoc_insertion_point(arena_constructor:google.protobuf.FileDescriptorProto)
}